

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt32 tt_cmap13_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  ulong uVar1;
  FT_UInt FVar2;
  FT_UInt32 FVar3;
  
  if ((*(char *)&cmap[1].cmap.charmap.face != '\0') &&
     (uVar1._0_4_ = cmap[1].cmap.charmap.encoding, uVar1._4_2_ = cmap[1].cmap.charmap.platform_id,
     uVar1._6_2_ = cmap[1].cmap.charmap.encoding_id, uVar1 == *pchar_code)) {
    tt_cmap13_next((TT_CMap13)cmap);
    if (*(char *)&cmap[1].cmap.charmap.face == '\0') {
      FVar3 = 0;
    }
    else {
      FVar3 = *(FT_UInt32 *)&cmap[1].cmap.clazz;
      *pchar_code = cmap[1].cmap.charmap.encoding;
    }
    return FVar3;
  }
  FVar2 = tt_cmap13_char_map_binary(cmap,pchar_code,'\x01');
  return FVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap13_char_next( TT_CMap     cmap,
                       FT_UInt32  *pchar_code )
  {
    TT_CMap13  cmap13 = (TT_CMap13)cmap;
    FT_UInt    gindex;


    /* no need to search */
    if ( cmap13->valid && cmap13->cur_charcode == *pchar_code )
    {
      tt_cmap13_next( cmap13 );
      if ( cmap13->valid )
      {
        gindex      = cmap13->cur_gindex;
        *pchar_code = cmap13->cur_charcode;
      }
      else
        gindex = 0;
    }
    else
      gindex = tt_cmap13_char_map_binary( cmap, pchar_code, 1 );

    return gindex;
  }